

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O2

void __thiscall
agg::pod_bvector<agg::point_base<double>,_6U>::allocate_block
          (pod_bvector<agg::point_base<double>,_6U> *this,uint nb)

{
  point_base<double> **__dest;
  point_base<double> *ppVar1;
  
  if (nb < this->m_max_blocks) {
    __dest = this->m_blocks;
  }
  else {
    __dest = pod_allocator<agg::point_base<double>_*>::allocate
                       (this->m_max_blocks + this->m_block_ptr_inc);
    if (this->m_blocks != (point_base<double> **)0x0) {
      memcpy(__dest,this->m_blocks,(ulong)this->m_num_blocks << 3);
      pod_allocator<agg::point_base<double>_*>::deallocate(this->m_blocks,this->m_max_blocks);
    }
    this->m_blocks = __dest;
    this->m_max_blocks = this->m_max_blocks + this->m_block_ptr_inc;
  }
  ppVar1 = (point_base<double> *)operator_new__(0x400);
  __dest[nb] = ppVar1;
  this->m_num_blocks = this->m_num_blocks + 1;
  return;
}

Assistant:

void pod_bvector<T, S>::allocate_block(unsigned nb)
    {
        if(nb >= m_max_blocks) 
        {
            T** new_blocks = pod_allocator<T*>::allocate(m_max_blocks + m_block_ptr_inc);

            if(m_blocks)
            {
                memcpy(new_blocks, 
                       m_blocks, 
                       m_num_blocks * sizeof(T*));

                pod_allocator<T*>::deallocate(m_blocks, m_max_blocks);
            }
            m_blocks = new_blocks;
            m_max_blocks += m_block_ptr_inc;
        }
        m_blocks[nb] = pod_allocator<T>::allocate(block_size);
        m_num_blocks++;
    }